

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O2

void __thiscall
booster::callback<void_(cppcms::http::context::completion_type)>::callback<async_test::binder>
          (callback<void_(cppcms::http::context::completion_type)> *this,binder *func)

{
  callable_impl<void,_async_test::binder> *this_00;
  binder local_50;
  
  this_00 = (callable_impl<void,_async_test::binder> *)operator_new(0x38);
  async_test::binder::binder(&local_50,func);
  callable_impl<void,_async_test::binder>::callable_impl(this_00,&local_50);
  (this->call_ptr).p_ = (callable<void_(cppcms::http::context::completion_type)> *)this_00;
  booster::atomic_counter::inc();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}